

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

void __thiscall
simple_thread_pool::ThreadHandle::ThreadHandle(ThreadHandle *this,ThreadPoolMgrBase *m,size_t id)

{
  this->myId = id;
  this->mgr = m;
  (this->myself).super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->myself).super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->assignedTask).
  super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->assignedTask).
  super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->assignedTaskLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->assignedTaskLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->assignedTaskLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->assignedTaskLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->assignedTaskLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  EventAwaiter::EventAwaiter(&this->eaLoop);
  return;
}

Assistant:

ThreadHandle(ThreadPoolMgrBase* m,
                 size_t id)
        : myId(id)
        , mgr(m)
        , myself(nullptr)
        , tHandle(nullptr)
        , assignedTask(nullptr)
        {}